

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> * __thiscall
Lib::OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator>::operator=
          (OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *this,
          OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *other)

{
  byte *in_RSI;
  OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *in_RDI;
  LeafIterator *t;
  EVP_PKEY_CTX local_38 [40];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *)0x31c397
          );
    Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator::~LeafIterator
              ((LeafIterator *)0x31c39f);
  }
  if ((*local_10 & 1) != 0) {
    t = (LeafIterator *)&in_RDI->_elem;
    unwrap((OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *)0x31c3c0
          );
    move_if_value<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator,_true>(t);
    MaybeUninit<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator>::init
              ((MaybeUninit<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *)t,
               local_38);
    Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator::~LeafIterator
              ((LeafIterator *)0x31c3e5);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }